

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_insert_after(lyd_node *sibling,lyd_node *node)

{
  ly_ctx *plVar1;
  ly_ctx *local_58;
  ly_ctx *local_50;
  ly_ctx *local_48;
  ly_ctx *local_40;
  ly_ctx *local_30;
  LY_ERR ret__;
  lyd_node *node_local;
  lyd_node *sibling_local;
  
  if (sibling == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","sibling",
           "lyd_insert_after");
    sibling_local._4_4_ = LY_EINVAL;
  }
  else if (node == (lyd_node *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","node","lyd_insert_after")
    ;
    sibling_local._4_4_ = LY_EINVAL;
  }
  else if (sibling == node) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","sibling != node",
           "lyd_insert_after");
    sibling_local._4_4_ = LY_EINVAL;
  }
  else {
    if (sibling->schema == (lysc_node *)0x0) {
      plVar1 = (ly_ctx *)sibling[2].schema;
    }
    else {
      plVar1 = sibling->schema->module->ctx;
    }
    if (plVar1 != (ly_ctx *)0x0) {
      if (node->schema == (lysc_node *)0x0) {
        plVar1 = (ly_ctx *)node[2].schema;
      }
      else {
        plVar1 = node->schema->module->ctx;
      }
      if (plVar1 != (ly_ctx *)0x0) {
        if (sibling->schema == (lysc_node *)0x0) {
          local_30 = (ly_ctx *)sibling[2].schema;
        }
        else {
          local_30 = sibling->schema->module->ctx;
        }
        if (node->schema == (lysc_node *)0x0) {
          local_40 = (ly_ctx *)node[2].schema;
        }
        else {
          local_40 = node->schema->module->ctx;
        }
        if (local_30 != local_40) {
          if (sibling->schema == (lysc_node *)0x0) {
            local_48 = (ly_ctx *)sibling[2].schema;
          }
          else {
            local_48 = sibling->schema->module->ctx;
          }
          ly_log(local_48,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
    }
    sibling_local._4_4_ = lyd_insert_check_schema((lysc_node *)0x0,sibling->schema,node->schema);
    if (sibling_local._4_4_ == LY_SUCCESS) {
      if ((node->schema == (lysc_node *)0x0) ||
         (((node->schema->nodetype & 0x18) != 0 && ((node->schema->flags & 0x40) != 0)))) {
        if ((node->schema == (lysc_node *)0x0) ||
           ((sibling->schema == (lysc_node *)0x0 || (node->schema == sibling->schema)))) {
          lyd_unlink(node);
          lyd_insert_after_node((lyd_node **)0x0,sibling,node);
          lyd_insert_hash(node);
          sibling_local._4_4_ = LY_SUCCESS;
        }
        else {
          if (sibling->schema == (lysc_node *)0x0) {
            local_58 = (ly_ctx *)sibling[2].schema;
          }
          else {
            local_58 = sibling->schema->module->ctx;
          }
          ly_log(local_58,LY_LLERR,LY_EINVAL,"Cannot insert after a different schema node instance."
                );
          sibling_local._4_4_ = LY_EINVAL;
        }
      }
      else {
        if (sibling->schema == (lysc_node *)0x0) {
          local_50 = (ly_ctx *)sibling[2].schema;
        }
        else {
          local_50 = sibling->schema->module->ctx;
        }
        ly_log(local_50,LY_LLERR,LY_EINVAL,"Can be used only for user-ordered nodes.");
        sibling_local._4_4_ = LY_EINVAL;
      }
    }
  }
  return sibling_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_insert_after(struct lyd_node *sibling, struct lyd_node *node)
{
    LY_CHECK_ARG_RET(NULL, sibling, node, sibling != node, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(LYD_CTX(sibling), LYD_CTX(node), LY_EINVAL);

    LY_CHECK_RET(lyd_insert_check_schema(NULL, sibling->schema, node->schema));

    if (node->schema && (!(node->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)) || !(node->schema->flags & LYS_ORDBY_USER))) {
        LOGERR(LYD_CTX(sibling), LY_EINVAL, "Can be used only for user-ordered nodes.");
        return LY_EINVAL;
    }
    if (node->schema && sibling->schema && (node->schema != sibling->schema)) {
        LOGERR(LYD_CTX(sibling), LY_EINVAL, "Cannot insert after a different schema node instance.");
        return LY_EINVAL;
    }

    lyd_unlink(node);
    lyd_insert_after_node(NULL, sibling, node);
    lyd_insert_hash(node);

    return LY_SUCCESS;
}